

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_getfenv(lua_State *L,int idx)

{
  GCObject *pGVar1;
  int iVar2;
  TValue *pTVar3;
  StkId pTVar4;
  
  pTVar3 = index2adr(L,idx);
  iVar2 = pTVar3->tt;
  if (iVar2 == 8) {
    pGVar1 = (pTVar3->value).gc;
    pTVar4 = L->top;
    pTVar4->value = (pGVar1->th).l_gt.value;
    iVar2 = (pGVar1->th).l_gt.tt;
  }
  else if ((iVar2 == 7) || (iVar2 == 6)) {
    pTVar4 = L->top;
    pTVar4->value = (Value)(((pTVar3->value).gc)->h).array;
    iVar2 = 5;
  }
  else {
    pTVar4 = L->top;
    iVar2 = 0;
  }
  pTVar4->tt = iVar2;
  L->top = L->top + 1;
  return;
}

Assistant:

LUA_API void lua_getfenv (lua_State *L, int idx) {
  StkId o;
  lua_lock(L);
  o = index2adr(L, idx);
  api_checkvalidindex(L, o);
  switch (ttype(o)) {
    case LUA_TFUNCTION:
      sethvalue(L, L->top, clvalue(o)->c.env);
      break;
    case LUA_TUSERDATA:
      sethvalue(L, L->top, uvalue(o)->env);
      break;
    case LUA_TTHREAD:
      setobj2s(L, L->top,  gt(thvalue(o)));
      break;
    default:
      setnilvalue(L->top);
      break;
  }
  api_incr_top(L);
  lua_unlock(L);
}